

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O2

xr_surface * __thiscall xray_re::xr_object::attach(xr_object *this,xr_raw_surface *raw_surface)

{
  int iVar1;
  mapped_type *__x;
  _func_int **pp_Var2;
  undefined4 extraout_var;
  mapped_type pxVar3;
  xr_object *pxVar4;
  
  __x = std::__detail::
        _Map_base<xray_re::xr_raw_surface,_std::pair<const_xray_re::xr_raw_surface,_xray_re::xr_surface_*>,_std::allocator<std::pair<const_xray_re::xr_raw_surface,_xray_re::xr_surface_*>_>,_std::__detail::_Select1st,_std::equal_to<xray_re::xr_raw_surface>,_std::hash<xray_re::xr_raw_surface>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
        ::operator[]((_Map_base<xray_re::xr_raw_surface,_std::pair<const_xray_re::xr_raw_surface,_xray_re::xr_surface_*>,_std::allocator<std::pair<const_xray_re::xr_raw_surface,_xray_re::xr_surface_*>_>,_std::__detail::_Select1st,_std::equal_to<xray_re::xr_raw_surface>,_std::hash<xray_re::xr_raw_surface>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&this->m_raw_surfaces,raw_surface);
  pxVar3 = *__x;
  if (pxVar3 == (mapped_type)0x0) {
    pxVar4 = (xr_object *)this->m_surface_factory;
    if (pxVar4 == (xr_object *)0x0) {
      pp_Var2 = (this->super_xr_surface_factory)._vptr_xr_surface_factory;
      pxVar4 = this;
    }
    else {
      pp_Var2 = (pxVar4->super_xr_surface_factory)._vptr_xr_surface_factory;
    }
    iVar1 = (*pp_Var2[2])(pxVar4,raw_surface);
    *__x = (mapped_type)CONCAT44(extraout_var,iVar1);
    if ((mapped_type)CONCAT44(extraout_var,iVar1) == (mapped_type)0x0) {
      __assert_fail("surface",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_object.cxx"
                    ,0x1b3,"xr_surface *xray_re::xr_object::attach(const xr_raw_surface &)");
    }
    std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>::push_back
              (&this->m_surfaces,__x);
    pxVar3 = *__x;
  }
  return pxVar3;
}

Assistant:

xr_surface* xr_object::attach(const xr_raw_surface& raw_surface)
{
	xr_surface*& surface = m_raw_surfaces[raw_surface];
	if (surface == 0) {
		surface = m_surface_factory ?
				m_surface_factory->create_surface(raw_surface) :
				create_surface(raw_surface);
		xr_assert(surface);
		m_surfaces.push_back(surface);
	}
	return surface;
}